

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

char * PAL_getenv(char *varname)

{
  int iVar1;
  char *pcVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = strcmp(varname,"");
    if (iVar1 == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = MiscGetenv(varname);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003091fc;
    }
    return pcVar2;
  }
LAB_003091fc:
  abort();
}

Assistant:

char * __cdecl PAL_getenv(const char *varname)
{
    char *retval;

    PERF_ENTRY(getenv);
    ENTRY("getenv (%p (%s))\n", varname ? varname : "NULL", varname ? varname : "NULL");

    if (strcmp(varname, "") == 0)
    {
        ERROR("getenv called with a empty variable name\n");
        LOGEXIT("getenv returning NULL\n");
        PERF_EXIT(getenv);
        return(NULL);
    }
    retval = MiscGetenv(varname);

    LOGEXIT("getenv returning %p\n", retval);
    PERF_EXIT(getenv);
    return(retval);
}